

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APIntOps::GreatestCommonDivisor(APIntOps *this,APInt *A,APInt *B)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  uint *puVar9;
  APInt *pAVar10;
  APInt AVar11;
  
  bVar3 = APInt::operator==(A,B);
  uVar8 = extraout_RDX;
  if (bVar3) {
    uVar5 = A->BitWidth;
  }
  else {
    uVar5 = A->BitWidth;
    if (uVar5 < 0x41) {
      bVar3 = (A->U).VAL == 0;
    }
    else {
      uVar7 = APInt::countLeadingZerosSlowCase(A);
      bVar3 = uVar7 == uVar5;
      uVar8 = extraout_RDX_00;
    }
    if (bVar3) {
      puVar9 = &B->BitWidth;
      *(uint *)(this + 8) = B->BitWidth;
      A = B;
      goto LAB_0019d80b;
    }
    uVar7 = B->BitWidth;
    if (uVar7 < 0x41) {
      bVar3 = (B->U).VAL == 0;
    }
    else {
      uVar4 = APInt::countLeadingZerosSlowCase(B);
      bVar3 = uVar4 == uVar7;
      uVar8 = extraout_RDX_01;
    }
    puVar9 = &A->BitWidth;
    if (bVar3) {
      *(uint *)(this + 8) = uVar5;
      goto LAB_0019d80b;
    }
    if (uVar5 < 0x41) {
      uVar1 = (A->U).VAL;
      if (uVar1 == 0) {
        uVar4 = 0x40;
      }
      else {
        lVar2 = 0;
        if (uVar1 != 0) {
          for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar4 = (uint)lVar2;
      }
      if (uVar5 < uVar4) {
        uVar4 = uVar5;
      }
    }
    else {
      uVar4 = APInt::countTrailingZerosSlowCase(A);
    }
    if (uVar7 < 0x41) {
      uVar1 = (B->U).VAL;
      if (uVar1 == 0) {
        uVar5 = 0x40;
      }
      else {
        lVar2 = 0;
        if (uVar1 != 0) {
          for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar5 = (uint)lVar2;
      }
      if (uVar7 < uVar5) {
        uVar5 = uVar7;
      }
    }
    else {
      uVar5 = APInt::countTrailingZerosSlowCase(B);
    }
    if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
      if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
        APInt::lshrInPlace(B,uVar5 - uVar4);
      }
    }
    else {
      APInt::lshrInPlace(A,uVar4 - uVar5);
      uVar4 = uVar5;
    }
    while (bVar3 = APInt::operator==(A,B), !bVar3) {
      iVar6 = APInt::compare(A,B);
      if (iVar6 < 1) {
        APInt::operator-=(B,A);
        uVar5 = B->BitWidth;
        pAVar10 = B;
        if (uVar5 < 0x41) {
          uVar1 = (B->U).VAL;
          if (uVar1 == 0) {
            uVar7 = 0x40;
          }
          else {
            lVar2 = 0;
            if (uVar1 != 0) {
              for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
              }
            }
            uVar7 = (uint)lVar2;
          }
          if (uVar5 < uVar7) {
            uVar7 = uVar5;
          }
        }
        else {
          uVar7 = APInt::countTrailingZerosSlowCase(B);
        }
      }
      else {
        APInt::operator-=(A,B);
        uVar5 = A->BitWidth;
        pAVar10 = A;
        if (uVar5 < 0x41) {
          uVar1 = (A->U).VAL;
          if (uVar1 == 0) {
            uVar7 = 0x40;
          }
          else {
            lVar2 = 0;
            if (uVar1 != 0) {
              for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
              }
            }
            uVar7 = (uint)lVar2;
          }
          if (uVar5 < uVar7) {
            uVar7 = uVar5;
          }
        }
        else {
          uVar7 = APInt::countTrailingZerosSlowCase(A);
        }
      }
      APInt::lshrInPlace(pAVar10,uVar7 - uVar4);
    }
    uVar5 = *puVar9;
    uVar8 = extraout_RDX_02;
  }
  puVar9 = &A->BitWidth;
  *(uint *)(this + 8) = uVar5;
LAB_0019d80b:
  *(anon_union_8_2_1313ab2f_for_U *)this = A->U;
  *puVar9 = 0;
  AVar11._8_8_ = uVar8;
  AVar11.U.pVal = (uint64_t *)this;
  return AVar11;
}

Assistant:

APInt llvm::APIntOps::GreatestCommonDivisor(APInt A, APInt B) {
  // Fast-path a common case.
  if (A == B) return A;

  // Corner cases: if either operand is zero, the other is the gcd.
  if (!A) return B;
  if (!B) return A;

  // Count common powers of 2 and remove all other powers of 2.
  unsigned Pow2;
  {
    unsigned Pow2_A = A.countTrailingZeros();
    unsigned Pow2_B = B.countTrailingZeros();
    if (Pow2_A > Pow2_B) {
      A.lshrInPlace(Pow2_A - Pow2_B);
      Pow2 = Pow2_B;
    } else if (Pow2_B > Pow2_A) {
      B.lshrInPlace(Pow2_B - Pow2_A);
      Pow2 = Pow2_A;
    } else {
      Pow2 = Pow2_A;
    }
  }

  // Both operands are odd multiples of 2^Pow_2:
  //
  //   gcd(a, b) = gcd(|a - b| / 2^i, min(a, b))
  //
  // This is a modified version of Stein's algorithm, taking advantage of
  // efficient countTrailingZeros().
  while (A != B) {
    if (A.ugt(B)) {
      A -= B;
      A.lshrInPlace(A.countTrailingZeros() - Pow2);
    } else {
      B -= A;
      B.lshrInPlace(B.countTrailingZeros() - Pow2);
    }
  }

  return A;
}